

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bcd2.c
# Opt level: O0

int bcd2_sub(long *bcd_low,long *bcd_high,long subend)

{
  char cVar1;
  long lVar2;
  ulong *in_RSI;
  ulong *in_RDI;
  int digit;
  long res;
  long carry;
  long tmp_hi;
  long tmp_lo;
  undefined8 local_50;
  undefined4 local_3c;
  undefined8 local_38;
  long *in_stack_ffffffffffffffd0;
  long lVar3;
  long *in_stack_ffffffffffffffd8;
  ulong in_stack_ffffffffffffffe0;
  
  bin_bcd2(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  lVar3 = 0;
  for (local_3c = 0; local_3c < 0xe; local_3c = local_3c + 1) {
    cVar1 = (char)local_3c;
    if (local_3c < 7) {
      lVar2 = (long)(*in_RDI & (long)(0xf << ((byte)(local_3c << 2) & 0x1f))) >>
              ((byte)(local_3c << 2) & 0x3f);
      local_50 = (long)(in_stack_ffffffffffffffe0 & (long)(0xf << ((byte)(local_3c << 2) & 0x1f)))
                 >> ((byte)(local_3c << 2) & 0x3f);
    }
    else {
      lVar2 = (long)(*in_RSI & (long)(0xf << ((cVar1 + -7) * '\x04' & 0x1fU))) >>
              ((cVar1 + -7) * '\x04' & 0x3fU);
      local_50 = (long)((ulong)in_stack_ffffffffffffffd8 &
                       (long)(0xf << ((cVar1 + -7) * '\x04' & 0x1fU))) >>
                 ((cVar1 + -7) * '\x04' & 0x3fU);
    }
    local_38 = (lVar2 - local_50) - lVar3;
    if (local_38 < 0) {
      local_38 = local_38 + 10;
      lVar3 = 1;
    }
    if (local_3c < 7) {
      *in_RDI = *in_RDI & (long)(int)(0xf << ((byte)(local_3c << 2) & 0x1f) ^ 0xfffffff);
      *in_RDI = local_38 << ((byte)(local_3c << 2) & 0x3f) | *in_RDI;
    }
    else {
      *in_RSI = (long)(int)(0xf << ((cVar1 + -7) * '\x04' & 0x1fU) ^ 0xfffffff) & *in_RSI;
      *in_RSI = local_38 << ((cVar1 + -7) * '\x04' & 0x3fU) | *in_RSI;
    }
  }
  return (int)lVar3;
}

Assistant:

int
bcd2_sub(long *bcd_low, long *bcd_high, long subend)
{
    long tmp_lo, tmp_hi, carry, res;
    int digit;

    bin_bcd2(subend, &tmp_lo, &tmp_hi);
    carry = 0;
    for (digit=0; digit < 14; digit++)
        {
        res = GET_DIGIT(digit, *bcd_low, *bcd_high); 
        res -= GET_DIGIT(digit, tmp_lo, tmp_hi);
        res -= carry;
        if (res < 0) 
			{
			res += 10;
			carry = 1;
			}
        SET_DIGIT(res, digit, bcd_low, bcd_high);
        }
    return(carry);
}